

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O3

void __thiscall
boost::asio::detail::op_queue<boost::asio::detail::wait_op>::~op_queue
          (op_queue<boost::asio::detail::wait_op> *this)

{
  wait_op *pwVar1;
  func_type p_Var2;
  wait_op *tmp;
  wait_op *pwVar3;
  error_code local_30;
  
  pwVar3 = this->front_;
  if (pwVar3 != (wait_op *)0x0) {
    do {
      pwVar1 = (wait_op *)(pwVar3->super_operation).next_;
      this->front_ = pwVar1;
      if (pwVar1 == (wait_op *)0x0) {
        this->back_ = (wait_op *)0x0;
      }
      (pwVar3->super_operation).next_ = (scheduler_operation *)0x0;
      p_Var2 = (pwVar3->super_operation).func_;
      local_30.m_val = 0;
      local_30.m_cat = system::system_category();
      (*p_Var2)((void *)0x0,&pwVar3->super_operation,&local_30,0);
      pwVar3 = this->front_;
    } while (pwVar3 != (wait_op *)0x0);
  }
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }